

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::WindingCase::iterate(WindingCase *this)

{
  int iVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  RenderContext *pRVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  deUint32 dVar7;
  int iVar8;
  undefined4 extraout_var;
  long lVar9;
  undefined4 extraout_var_01;
  ObjectTraits *traits;
  Surface *surface;
  uint uVar10;
  void *__buf;
  bool bVar11;
  int iVar12;
  ostringstream *poVar13;
  qpTestResult testResult;
  char *pcVar14;
  ulong uVar15;
  int iVar16;
  Winding WVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  Surface rendered;
  RandomViewport viewport;
  VertexArray vao;
  Surface local_240;
  RandomViewport local_228;
  long local_218;
  RenderContext *local_210;
  string local_208;
  string local_1e8;
  ObjectWrapper local_1c8;
  undefined1 local_1b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0;
  _Alloc_hider local_190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_180 [4];
  ios_base local_138 [264];
  undefined4 extraout_var_00;
  
  paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  pRVar3 = ((this->super_TestCase).m_context)->m_renderCtx;
  iVar6 = (*pRVar3->_vptr_RenderContext[4])(pRVar3);
  dVar7 = deStringHash((this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p)
  ;
  deqp::gls::TextureTestUtil::RandomViewport::RandomViewport
            (&local_228,(RenderTarget *)CONCAT44(extraout_var,iVar6),0x40,0x40,dVar7);
  dVar7 = (((this->m_program).m_ptr)->m_program).m_program;
  iVar6 = (*pRVar3->_vptr_RenderContext[3])(pRVar3);
  lVar9 = CONCAT44(extraout_var_00,iVar6);
  local_210 = pRVar3;
  iVar6 = (*pRVar3->_vptr_RenderContext[3])(pRVar3);
  traits = glu::objectTraits(OBJECTTYPE_VERTEX_ARRAY);
  glu::ObjectWrapper::ObjectWrapper(&local_1c8,(Functions *)CONCAT44(extraout_var_01,iVar6),traits);
  (**(code **)(lVar9 + 0x1a00))(local_228.x,local_228.y,local_228.width,local_228.height);
  (**(code **)(lVar9 + 0x1c0))(0x3f800000,0,0,0x3f800000);
  (**(code **)(lVar9 + 0x1680))(dVar7);
  (**(code **)(lVar9 + 0xfd8))(0x8e72,1);
  (**(code **)(lVar9 + 0x5e0))(0xb44);
  (**(code **)(lVar9 + 0xd8))(local_1c8.m_object);
  poVar13 = (ostringstream *)(local_1b0 + 8);
  local_1b0._0_8_ = paVar2;
  std::__cxx11::ostringstream::ostringstream(poVar13);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar13,"Face culling enabled",0x14)
  ;
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar13);
  std::ios_base::~ios_base(local_138);
  bVar11 = false;
  WVar17 = WINDING_CCW;
  local_218 = lVar9;
  bVar4 = true;
  do {
    bVar5 = bVar4;
    lVar9 = local_218;
    poVar13 = (ostringstream *)(local_1b0 + 8);
    local_1b0._0_8_ = paVar2;
    std::__cxx11::ostringstream::ostringstream(poVar13);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar13,"Setting glFrontFace(",0x14);
    pcVar14 = "GL_CCW";
    if (bVar11) {
      pcVar14 = "GL_CW";
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar13,pcVar14,6 - (ulong)bVar11)
    ;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar13,")",1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar13);
    std::ios_base::~ios_base(local_138);
    (**(code **)(lVar9 + 0x6c0))(bVar11 ^ 0x901);
    (**(code **)(lVar9 + 0x188))(0x4000);
    (**(code **)(lVar9 + 0x538))(0xe,0,1);
    dVar7 = (**(code **)(lVar9 + 0x800))();
    glu::checkError(dVar7,"Draw failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationTests.cpp"
                    ,0xb07);
    getPixels(&local_240,local_210,local_228.x,local_228.y,local_228.width,local_228.height);
    local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"RenderedImage","");
    local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"Rendered Image","");
    surface = &local_240;
    tcu::LogImage::LogImage
              ((LogImage *)local_1b0,&local_1e8,&local_208,surface,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write((LogImage *)local_1b0,(int)paVar2,__buf,(size_t)surface);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_p != local_180) {
      operator_delete(local_190._M_p,local_180[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._0_8_ != &local_1a0) {
      operator_delete((void *)local_1b0._0_8_,local_1a0._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    }
    iVar18 = local_240.m_height;
    iVar6 = local_240.m_width;
    uVar10 = local_240.m_height;
    if (local_240.m_height < local_240.m_width) {
      uVar10 = local_240.m_width;
    }
    iVar19 = 0;
    iVar12 = uVar10 * 5;
    if (this->m_primitiveType != TESSPRIMITIVETYPE_TRIANGLES) {
      iVar12 = 0;
    }
    iVar20 = 0;
    if (0 < local_240.m_height) {
      iVar8 = 0;
      uVar10 = 0;
      iVar20 = 0;
      iVar19 = 0;
      do {
        uVar15 = (ulong)(uint)local_240.m_width;
        iVar16 = iVar8;
        if (0 < local_240.m_width) {
          do {
            iVar1 = *(int *)((long)local_240.m_pixels.m_ptr + (long)iVar16 * 4);
            iVar20 = iVar20 + (uint)(iVar1 == -1);
            iVar19 = iVar19 + (uint)(iVar1 == -0xffff01);
            iVar16 = iVar16 + 1;
            uVar15 = uVar15 - 1;
          } while (uVar15 != 0);
        }
        uVar10 = uVar10 + 1;
        iVar8 = iVar8 + local_240.m_width;
      } while (uVar10 != local_240.m_height);
    }
    poVar13 = (ostringstream *)(local_1b0 + 8);
    local_1b0._0_8_ = paVar2;
    std::__cxx11::ostringstream::ostringstream(poVar13);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar13,"Note: got ",10);
    std::ostream::operator<<(poVar13,iVar20);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar13," white and ",0xb);
    std::ostream::operator<<(poVar13,iVar19);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar13," red pixels",0xb);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    iVar18 = iVar18 * iVar6;
    std::__cxx11::ostringstream::~ostringstream(poVar13);
    std::ios_base::~ios_base(local_138);
    iVar6 = iVar18 - (iVar19 + iVar20);
    if (iVar12 < iVar6) {
      poVar13 = (ostringstream *)(local_1b0 + 8);
      local_1b0._0_8_ = paVar2;
      std::__cxx11::ostringstream::ostringstream(poVar13);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar13,"Failure: Got ",0xd);
      std::ostream::operator<<(poVar13,iVar6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar13," other than white or red pixels (maximum tolerance ",0x33);
      std::ostream::operator<<(poVar13,iVar12);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar13,")",1);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_01404488:
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
      std::ios_base::~ios_base(local_138);
      tcu::Surface::~Surface(&local_240);
      pcVar14 = "Image verification failed";
      testResult = QP_TEST_RESULT_FAIL;
      goto LAB_014044b0;
    }
    if (WVar17 == this->m_winding) {
      if (this->m_primitiveType == TESSPRIMITIVETYPE_QUADS) {
        if (iVar20 != iVar18) {
          local_1b0._0_8_ = paVar2;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_1b0 + 8),
                     "Failure: expected only white pixels (full-viewport quad)",0x38);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          goto LAB_01404488;
        }
      }
      else if (this->m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES) {
        iVar20 = iVar20 - iVar18 / 2;
        iVar6 = -iVar20;
        if (0 < iVar20) {
          iVar6 = iVar20;
        }
        if (iVar12 < iVar6) {
          poVar13 = (ostringstream *)(local_1b0 + 8);
          local_1b0._0_8_ = paVar2;
          std::__cxx11::ostringstream::ostringstream(poVar13);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar13,
                     "Failure: wrong number of white pixels; expected approximately ",0x3e);
          std::ostream::operator<<(poVar13,iVar18 / 2);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          goto LAB_01404488;
        }
      }
    }
    else if (iVar20 != 0) {
      local_1b0._0_8_ = paVar2;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1b0 + 8),"Failure: expected only red pixels (everything culled)",
                 0x35);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      goto LAB_01404488;
    }
    tcu::Surface::~Surface(&local_240);
    testResult = QP_TEST_RESULT_PASS;
    WVar17 = WINDING_CW;
    bVar11 = true;
    bVar4 = false;
  } while (bVar5);
  pcVar14 = "Pass";
LAB_014044b0:
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,testResult,pcVar14);
  glu::ObjectWrapper::~ObjectWrapper(&local_1c8);
  return STOP;
}

Assistant:

WindingCase::IterateResult WindingCase::iterate (void)
{
	TestLog&						log							= m_testCtx.getLog();
	const RenderContext&			renderCtx					= m_context.getRenderContext();
	const RandomViewport			viewport					(renderCtx.getRenderTarget(), RENDER_SIZE, RENDER_SIZE, deStringHash(getName()));
	const deUint32					programGL					= m_program->getProgram();
	const glw::Functions&			gl							= renderCtx.getFunctions();
	const glu::VertexArray			vao							(renderCtx);

	bool							success						= true;

	setViewport(gl, viewport);
	gl.clearColor(1.0f, 0.0f, 0.0f, 1.0f);
	gl.useProgram(programGL);

	gl.patchParameteri(GL_PATCH_VERTICES, 1);

	gl.enable(GL_CULL_FACE);

	gl.bindVertexArray(*vao);

	log << TestLog::Message << "Face culling enabled" << TestLog::EndMessage;

	for (int frontFaceWinding = 0; frontFaceWinding < WINDING_LAST; frontFaceWinding++)
	{
		log << TestLog::Message << "Setting glFrontFace(" << (frontFaceWinding == WINDING_CW ? "GL_CW" : "GL_CCW") << ")" << TestLog::EndMessage;

		gl.frontFace(frontFaceWinding == WINDING_CW ? GL_CW : GL_CCW);

		gl.clear(GL_COLOR_BUFFER_BIT);
		gl.drawArrays(GL_PATCHES, 0, 1);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Draw failed");

		{
			const tcu::Surface rendered = getPixels(renderCtx, viewport);
			log << TestLog::Image("RenderedImage", "Rendered Image", rendered);

			{
				const int totalNumPixels		= rendered.getWidth()*rendered.getHeight();
				const int badPixelTolerance		= m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES ? 5*de::max(rendered.getWidth(), rendered.getHeight()) : 0;

				int numWhitePixels	= 0;
				int numRedPixels	= 0;
				for (int y = 0; y < rendered.getHeight();	y++)
				for (int x = 0; x < rendered.getWidth();	x++)
				{
					numWhitePixels	+= rendered.getPixel(x, y) == tcu::RGBA::white()	? 1 : 0;
					numRedPixels	+= rendered.getPixel(x, y) == tcu::RGBA::red()	? 1 : 0;
				}

				DE_ASSERT(numWhitePixels + numRedPixels <= totalNumPixels);

				log << TestLog::Message << "Note: got " << numWhitePixels << " white and " << numRedPixels << " red pixels" << TestLog::EndMessage;

				if (totalNumPixels - numWhitePixels - numRedPixels > badPixelTolerance)
				{
					log << TestLog::Message << "Failure: Got " << totalNumPixels - numWhitePixels - numRedPixels << " other than white or red pixels (maximum tolerance " << badPixelTolerance << ")" << TestLog::EndMessage;
					success = false;
					break;
				}

				if ((Winding)frontFaceWinding == m_winding)
				{
					if (m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES)
					{
						if (de::abs(numWhitePixels - totalNumPixels/2) > badPixelTolerance)
						{
							log << TestLog::Message << "Failure: wrong number of white pixels; expected approximately " << totalNumPixels/2 << TestLog::EndMessage;
							success = false;
							break;
						}
					}
					else if (m_primitiveType == TESSPRIMITIVETYPE_QUADS)
					{
						if (numWhitePixels != totalNumPixels)
						{
							log << TestLog::Message << "Failure: expected only white pixels (full-viewport quad)" << TestLog::EndMessage;
							success = false;
							break;
						}
					}
					else
						DE_ASSERT(false);
				}
				else
				{
					if (numWhitePixels != 0)
					{
						log << TestLog::Message << "Failure: expected only red pixels (everything culled)" << TestLog::EndMessage;
						success = false;
						break;
					}
				}
			}
		}
	}

	m_testCtx.setTestResult(success ? QP_TEST_RESULT_PASS : QP_TEST_RESULT_FAIL, success ? "Pass" : "Image verification failed");
	return STOP;
}